

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

Regex * google::protobuf::Arena::CreateMaybeMessage<bloaty::Regex>(Arena *arena)

{
  type_info *in_RDI;
  size_t n;
  size_t in_stack_ffffffffffffff90;
  Arena *in_stack_ffffffffffffffa0;
  type_info *n_00;
  ArenaImpl *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  
  if (in_RDI == (type_info *)0x0) {
    local_38 = (Regex *)operator_new(0x28);
    bloaty::Regex::Regex(local_38);
  }
  else {
    n_00 = in_RDI;
    internal::AlignUpTo8(0x28);
    AllocHook(in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff90);
    local_38 = (Regex *)internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                  (in_stack_ffffffffffffffb0,(size_t)n_00,
                                   (_func_void_void_ptr *)in_stack_ffffffffffffffa0);
    bloaty::Regex::Regex((Regex *)in_stack_ffffffffffffffa0);
  }
  return local_38;
}

Assistant:

PROTOBUF_NOINLINE ::bloaty::Regex* Arena::CreateMaybeMessage< ::bloaty::Regex >(Arena* arena) {
  return Arena::CreateInternal< ::bloaty::Regex >(arena);
}